

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reporter.hpp
# Opt level: O0

void __thiscall beast::unit_test::detail::reporter<void>::reporter(reporter<void> *this,ostream *os)

{
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  ostream *local_18;
  ostream *os_local;
  reporter<void> *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  runner::runner(&this->super_runner);
  (this->super_runner)._vptr_runner = (_func_int **)&PTR__reporter_00519030;
  this->os_ = local_18;
  results::results(&this->results_);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_38,"",&local_39);
  suite_results::suite_results(&this->suite_results_,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_70,"",&local_71);
  case_results::case_results(&this->case_results_,&local_70);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_71);
  return;
}

Assistant:

reporter<_>::
reporter(std::ostream& os)
    : os_(os)
{
}